

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void P_ResumeConversation(void)

{
  bool bVar1;
  AActor *npc;
  AActor *pc;
  long lVar2;
  player_t *p;
  int i;
  
  for (p._4_4_ = 0; p._4_4_ < 8; p._4_4_ = p._4_4_ + 1) {
    if ((playeringame[p._4_4_] & 1U) != 0) {
      lVar2 = (long)p._4_4_ * 0x2a0;
      bVar1 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(lVar2 + 0x1ae7348),(AActor *)0x0);
      if ((bVar1) &&
         (bVar1 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(lVar2 + 0x1ae7340),(AActor *)0x0),
         bVar1)) {
        npc = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(lVar2 + 0x1ae7340));
        pc = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(lVar2 + 0x1ae7348));
        P_StartConversation(npc,pc,(bool)((&DAT_01ae7358)[lVar2] & 1),false);
      }
    }
  }
  return;
}

Assistant:

void P_ResumeConversation ()
{
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		player_t *p = &players[i];

		if (p->ConversationPC != NULL && p->ConversationNPC != NULL)
		{
			P_StartConversation (p->ConversationNPC, p->ConversationPC, p->ConversationFaceTalker, false);
		}
	}
}